

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

void __thiscall BmsNoteManager::FixIncorrectLongNote(BmsNoteManager *this)

{
  _Rb_tree_color bar;
  undefined1 *puVar1;
  _Base_ptr p_Var2;
  int c;
  long lVar3;
  BmsNoteLane *this_00;
  bool isln [20];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  BmsNote _tmp;
  char local_a8 [32];
  BmsNoteLane *local_88;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_80;
  BmsNote local_50;
  
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = this->lanes_;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  GetNoteExistBar(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_80);
  for (p_Var2 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_80._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bar = p_Var2[1]._M_color;
    this_00 = local_88;
    for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
      BmsNoteLane::Get(&local_50,this_00,bar);
      if (local_50.type == 3) {
        if (local_a8[lVar3] == '\0') {
          puVar1 = (undefined1 *)std::_Rb_tree_increment(p_Var2);
          local_50.type = ((_Rb_tree_header *)puVar1 != &local_80._M_impl.super__Rb_tree_header) + 1
          ;
          BmsNoteLane::Set(this_00,bar,&local_50);
        }
        local_a8[lVar3] = '\0';
      }
      else if (local_50.type == 2) {
        if (local_a8[lVar3] == '\x01') {
          BmsNoteLane::Delete(this_00,bar);
        }
        local_a8[lVar3] = '\x01';
      }
      BmsWord::~BmsWord(&local_50.value);
      this_00 = this_00 + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_80);
  return;
}

Assistant:

void BmsNoteManager::FixIncorrectLongNote() {
	// there's may be 2 cases -
	// - LN_START after LN_START / LN_END after LN_END
	// - NORMAL_NOTE during LN
	// first case must be fixed.
	// second case well.. removing note isn't solution because keysound will be deleted.
	// (you'll get miss if you don't hit not during LN... or act like HELLCHARGE note.)
	bool isln[20] = { false, };
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		for (int c = 0; c < 20; c++) {
			BmsNote _tmp = lanes_[c].Get(bar);
			/*
			 * case: LNSTART reached, but currently considered as longnote status
			 * solution: ignore current note
			 */
			if (_tmp.type == BmsNote::NOTE_LNSTART) {
				if (isln[c] == true) {
					lanes_[c].Delete(bar);
				}
				isln[c] = true;
			}
			/*
			 * case: LNEND reached, but current note wasn't longnote.
			 * solution: set NORMAL
			 */
			else if (_tmp.type == BmsNote::NOTE_LNEND) {
				if (isln[c] == false) {
					auto nextit = it;
					if (++nextit == notemap.end())
						_tmp.type = BmsNote::NOTE_NORMAL;
					else
						_tmp.type = BmsNote::NOTE_LNSTART;
					lanes_[c].Set(bar, _tmp);
				}
				isln[c] = false;
			}
		}
	}
}